

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O2

ll128 * __thiscall
reed_solomn::lc(ll128 *__return_storage_ptr__,reed_solomn *this,
               vector<__int128,_std::allocator<__int128>_> *A)

{
  ll128 *plVar1;
  ostream *poVar2;
  vector<__int128,_std::allocator<__int128>_> *A_00;
  reed_solomn *__return_storage_ptr___00;
  
  __return_storage_ptr___00 = (reed_solomn *)&stack0xffffffffffffffd0;
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)&stack0xffffffffffffffd0,
             (vector<__int128,_std::allocator<__int128>_> *)this);
  plVar1 = degree((ll128 *)__return_storage_ptr___00,(reed_solomn *)&stack0xffffffffffffffd0,A_00);
  std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base
            ((_Vector_base<__int128,_std::allocator<__int128>_> *)&stack0xffffffffffffffd0);
  poVar2 = std::operator<<((ostream *)&std::cout,"deg: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)plVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return (ll128 *)this->_vptr_reed_solomn[(long)(int)plVar1 * 2];
}

Assistant:

ll128 reed_solomn::lc(vector<ll128> A) {
    int deg = degree(A);
    cout << "deg: " << deg << endl;
    return A[deg];
}